

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_4xx6_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[1]) {
  case 0:
    sh4asm_txt_ldsl_armp_mach(em,quads[2]);
    break;
  case 1:
    sh4asm_txt_ldsl_armp_macl(em,quads[2]);
    break;
  case 2:
    sh4asm_txt_ldsl_armp_pr(em,quads[2]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 5:
    sh4asm_txt_ldsl_armp_fpul(em,quads[2]);
    break;
  case 6:
    sh4asm_txt_ldsl_armp_fpscr(em,quads[2]);
    break;
  case 0xf:
    sh4asm_txt_ldcl_armp_dbr(em,quads[2]);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_4xx6_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        sh4asm_txt_ldsl_armp_mach(em, quads[2]);
        break;
    case 1:
        sh4asm_txt_ldsl_armp_macl(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_ldsl_armp_pr(em, quads[2]);
        break;
    case 5:
        sh4asm_txt_ldsl_armp_fpul(em, quads[2]);
        break;
    case 6:
        sh4asm_txt_ldsl_armp_fpscr(em, quads[2]);
        break;
    case 15:
        sh4asm_txt_ldcl_armp_dbr(em, quads[2]);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}